

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O2

void __thiscall LinkInfo::parseLinkInfoHeaderSize(LinkInfo *this)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20,
             &this->LinkInfoHeaderSize);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_20);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  std::operator<<(poVar2," bytes. ");
  if (uVar1 == 0x1c) {
    pcVar3 = "Offsets to the optional fields are not specified.";
  }
  else {
    if ((int)uVar1 < 0x24) {
      return;
    }
    pcVar3 = "Offsets to the optional fields are specified.";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void LinkInfo::parseLinkInfoHeaderSize() {
    int len = Utils::lenFourBytes(LinkInfoHeaderSize);
    cout << dec << len << " bytes. ";
    if (len == 0x0000001C)
        cout << "Offsets to the optional fields are not specified." << endl;
    else if(len >= 0x00000024) {
        cout << "Offsets to the optional fields are specified." << endl;
    }
}